

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

const_reference __thiscall immutable::vector<int,_false,_6>::front(vector<int,_false,_6> *this)

{
  int *piVar1;
  vector<int,_false,_6> *this_local;
  
  piVar1 = rrb_nth<int,false,6>(&this->_impl,0);
  return piVar1;
}

Assistant:

const_reference front() const
        {
        return rrb_nth(_impl, 0);
        }